

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemIOCallback.cpp
# Opt level: O1

void __thiscall libebml::MemIOCallback::~MemIOCallback(MemIOCallback *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_IOCallback)._vptr_IOCallback = (_func_int **)&PTR__MemIOCallback_001cdfb8;
  if (this->dataBuffer != (binary *)0x0) {
    free(this->dataBuffer);
  }
  pcVar1 = (this->mLastErrorStr)._M_dataplus._M_p;
  paVar2 = &(this->mLastErrorStr).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

MemIOCallback::~MemIOCallback()
{
  if (dataBuffer != NULL)
    free(dataBuffer);
}